

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.h
# Opt level: O2

void AssertNoMatch(CMReturn In)

{
  allocator<char> local_ae;
  allocator<char> local_ad;
  _CM_RETURN_STATUS local_ac;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  local_ac = NO_MATCH;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"AssertNoMatch",&local_ad);
  std::operator+(&local_68,&local_28,": ");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"NO_MATCH == In.Status",&local_ae);
  cute::cute_to_string::backslashQuoteTabNewline(&local_88,&local_a8);
  std::operator+(&local_48,&local_68,&local_88);
  cute::assert_equal<_CM_RETURN_STATUS,_CM_RETURN_STATUS>
            (&local_ac,&In.Status,&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/UnitTest.h"
             ,0x21);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void AssertNoMatch(CMReturn In)
{
	ASSERT_EQUAL(NO_MATCH, In.Status);
}